

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O1

void __thiscall
vkt::api::anon_unknown_0::CheckEnumerateDeviceExtensionPropertiesIncompleteResult::
~CheckEnumerateDeviceExtensionPropertiesIncompleteResult
          (CheckEnumerateDeviceExtensionPropertiesIncompleteResult *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_CheckIncompleteResult<vk::VkExtensionProperties>)._vptr_CheckIncompleteResult =
       (_func_int **)&PTR__CheckEnumerateDeviceExtensionPropertiesIncompleteResult_00d54350;
  pcVar2 = (this->m_layerName)._M_dataplus._M_p;
  paVar1 = &(this->m_layerName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x30);
  return;
}

Assistant:

CheckEnumerateDeviceExtensionPropertiesIncompleteResult (std::string layerName = std::string()) : m_layerName(layerName) {}